

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

Type * slang::ast::Type::getPredefinedType(Compilation *compilation,SyntaxKind kind,bool isSigned)

{
  SymbolKind SVar1;
  Type *this;
  PredefinedIntegerType *pPVar2;
  bool local_9;
  
  local_9 = isSigned;
  this = Compilation::getType(compilation,kind);
  pPVar2 = (PredefinedIntegerType *)Symbol::as<slang::ast::IntegralType>(&this->super_Symbol);
  if (local_9 != (pPVar2->super_IntegralType).isSigned) {
    SVar1 = (pPVar2->super_IntegralType).super_Type.super_Symbol.kind;
    if (SVar1 == PredefinedIntegerType) {
      pPVar2 = BumpAllocator::
               emplace<slang::ast::PredefinedIntegerType,slang::ast::PredefinedIntegerType::Kind_const&,bool&>
                         (&compilation->super_BumpAllocator,&pPVar2->integerKind,&local_9);
    }
    else {
      if (SVar1 != ScalarType) {
        assert::assertFailed
                  ("T::isKind(kind)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                   ,0xc4,
                   "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::PredefinedIntegerType]"
                  );
      }
      pPVar2 = (PredefinedIntegerType *)
               BumpAllocator::
               emplace<slang::ast::ScalarType,slang::ast::ScalarType::Kind_const&,bool&>
                         (&compilation->super_BumpAllocator,&pPVar2->integerKind,&local_9);
    }
  }
  return (Type *)pPVar2;
}

Assistant:

const Type& Type::getPredefinedType(Compilation& compilation, SyntaxKind kind, bool isSigned) {
    auto& predef = compilation.getType(kind).as<IntegralType>();
    if (isSigned == predef.isSigned)
        return predef;

    if (predef.kind == SymbolKind::ScalarType)
        return *compilation.emplace<ScalarType>(predef.as<ScalarType>().scalarKind, isSigned);

    return *compilation.emplace<PredefinedIntegerType>(
        predef.as<PredefinedIntegerType>().integerKind, isSigned);
}